

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O2

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::GetTexRenderOffset
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo)

{
  GMM_TILE_INFO *pGVar1;
  GMM_TILE_MODE GVar2;
  ulong uVar3;
  anon_struct_8_45_9b07292e_for_Gpu aVar4;
  uint8_t uVar5;
  uint uVar6;
  uint uVar7;
  GMM_PLATFORM_INFO *pGVar8;
  undefined4 extraout_var;
  uint uVar9;
  ulong uVar10;
  anon_struct_8_44_94931171_for_Info aVar11;
  ulong uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t local_38;
  uint32_t OffsetZ;
  
  OffsetZ = 0;
  if (pReqInfo == (GMM_REQ_OFFSET_INFO *)0x0 || pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return GMM_ERROR;
  }
  pGVar8 = GmmGetPlatformInfo(this->pGmmLibContext);
  GVar2 = pTexInfo->TileMode;
  uVar6 = (*this->_vptr_GmmTextureCalc[0x10])(this,pTexInfo,pReqInfo);
  uVar12 = CONCAT44(extraout_var,uVar6);
  if (pGVar8->TileInfo[GVar2].LogicalSize == 0) {
    uVar13 = uVar6 & 3;
    uVar10 = (ulong)uVar13;
    uVar12 = uVar12 & 0xfffffffffffffffc;
    uVar3 = pTexInfo->Pitch;
    if (uVar3 == 0) {
      uVar14 = 0;
    }
    else {
      uVar13 = (uint32_t)(uVar10 % uVar3);
      uVar14 = (uint32_t)(uVar10 / uVar3);
    }
    goto LAB_001babcf;
  }
  aVar11 = (pTexInfo->Flags).Info;
  if ((((ulong)aVar11 & 0x106000000000) != 0) &&
     ((pTexInfo->Alignment).MipTailStartLod <= pReqInfo->MipLevel)) {
    uVar6 = (*this->_vptr_GmmTextureCalc[9])(this,pTexInfo);
    uVar12 = uVar12 - uVar6;
    aVar11 = (pTexInfo->Flags).Info;
  }
  if ((aVar11._0_4_ >> 0x1c & 1) != 0) {
    uVar14 = 0;
    uVar13 = 0;
    goto LAB_001babcf;
  }
  pGVar1 = pGVar8->TileInfo + GVar2;
  uVar3 = pTexInfo->Pitch;
  uVar10 = uVar3;
  if (uVar3 == 0) {
    uVar10 = pTexInfo->Size;
  }
  aVar4 = (pTexInfo->Flags).Gpu;
  uVar6 = pGVar1->LogicalTileWidth;
  uVar9 = (uint)(uVar12 % uVar10);
  if (((byte)((ulong)aVar11 >> 0x22) & (byte)((ulong)aVar4 >> 0x1d) & 1) == 0) {
    local_38 = uVar6 - 1 & uVar9;
    uVar9 = uVar9 - local_38;
    if (uVar3 == 0) {
      uVar7 = 0;
      uVar14 = 0;
    }
    else {
      if ((aVar4._0_4_ >> 0x1d & 1) != 0 && ((ulong)aVar11 >> 0x22 & 1) != 0) goto LAB_001bab2b;
      uVar7 = (uint)(uVar12 / uVar3);
      uVar14 = pGVar1->LogicalTileDepth * pGVar1->LogicalTileHeight - 1 & uVar7;
      uVar7 = uVar7 - uVar14;
      OffsetZ = uVar14;
    }
  }
  else {
    local_38 = (uVar6 >> 1) - 1 & uVar9;
    uVar9 = uVar9 - local_38;
    uVar7 = 0;
    uVar14 = 0;
    if (uVar3 != 0) {
LAB_001bab2b:
      uVar7 = (int)(uVar12 / uVar3) * 2;
      uVar14 = pGVar1->LogicalTileHeight * pGVar1->LogicalTileDepth * 2 - 1 & uVar7;
      uVar7 = uVar7 - uVar14 >> 1;
      OffsetZ = uVar14;
    }
  }
  uVar13 = local_38;
  uVar12 = (ulong)((uVar9 / uVar6) * pGVar1->LogicalSize) + uVar3 * uVar7;
  if (((((ulong)aVar11 & 0x106000000000) != 0) &&
      ((pTexInfo->Alignment).MipTailStartLod <= pReqInfo->MipLevel)) &&
     (uVar5 = GmmIsPlanar(pTexInfo->Format), uVar5 == '\0')) {
    (*this->_vptr_GmmTextureCalc[10])(this,pTexInfo,(ulong)pReqInfo->MipLevel,&local_38,&OffsetZ);
    uVar14 = OffsetZ;
    uVar13 = local_38;
  }
LAB_001babcf:
  (pReqInfo->Render).field_0.Offset64 = uVar12;
  (pReqInfo->Render).XOffset = uVar13;
  (pReqInfo->Render).YOffset = uVar14;
  (pReqInfo->Render).ZOffset = 0;
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::GetTexRenderOffset(GMM_TEXTURE_INFO *   pTexInfo,
                                                      GMM_REQ_OFFSET_INFO *pReqInfo)
{

    const GMM_TILE_INFO *    pTileInfo         = NULL;
    GMM_GFX_SIZE_T           AddressOffset     = 0;
    GMM_GFX_SIZE_T           RenderAlignOffset = 0;
    uint32_t                 OffsetX           = 0;
    uint32_t                 OffsetY           = 0;
    uint32_t                 OffsetZ           = 0;
    const GMM_PLATFORM_INFO *pPlatform         = NULL;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pReqInfo, GMM_ERROR);

    pPlatform     = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);
    pTileInfo     = &pPlatform->TileInfo[pTexInfo->TileMode];
    AddressOffset = GetMipMapByteAddress(pTexInfo, pReqInfo);

    if(GMM_IS_TILED(*pTileInfo))
    {
        uint32_t       TileAlignedOffsetX = 0;
        uint32_t       TileAlignedOffsetY = 0;
        GMM_GFX_SIZE_T MipTailByteOffset  = 0;

        //--- Compute Tile-Aligned Offset, and Corresponding X/Y Offsets -------
        // Render/Tiled-Aligned offsets and corresponding X/Y offsets are used
        // to program the Surface Base Address and X/Y Offset fields of a
        // SURFACE_STATE. For a given subresource, the tiled-aligned offset
        // addresses the tile containing the base of the subresource; the X/Y
        // offsets then give the additional offsets into the tile of the
        // subresource base. (Though in SURFACE_STATE, X Offset is specified in
        // pixels, this function will return the X Offset in bytes. Y Offset is
        // in pixel rows.)

        if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
           (pReqInfo->MipLevel >= pTexInfo->Alignment.MipTailStartLod))
        {
            MipTailByteOffset = GetMipTailByteOffset(pTexInfo, pReqInfo->MipLevel);

            // For MipTail, Offset is really with respect to start of MipTail,
            // so taking out individual Mipoffset within miptail region to get correct Tile aligned offset.
            AddressOffset -= MipTailByteOffset;
        }

        if(!pTexInfo->Flags.Info.RedecribedPlanes)
        {
            GMM_GFX_SIZE_T Pitch = pTexInfo->Pitch;
            if(!pTexInfo->Pitch)
            {
                // If no pitch exists, but the surface is still marked as tiled, then it is a 1D TileYf/Ys surface.
                // Technically no pitch exists for 1D surfaces, but we will fake it to make calculations work below.
                // Since 1D surfaces only have an X-dimension, this Pitch calculation is only used for OffsetX calculation.
                Pitch = pTexInfo->Size;
            }
	    
	    if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
            {
                OffsetX            = GFX_ULONG_CAST(AddressOffset % Pitch);
                TileAlignedOffsetX = GFX_ALIGN_FLOOR(OffsetX, pTileInfo->LogicalTileWidth / 2);
                OffsetX -= TileAlignedOffsetX;
            }
            else
            {
                OffsetX            = GFX_ULONG_CAST(AddressOffset % Pitch);
                TileAlignedOffsetX = GFX_ALIGN_FLOOR(OffsetX, pTileInfo->LogicalTileWidth);
                OffsetX -= TileAlignedOffsetX;
            }

            if(pTexInfo->Pitch)
            {
                if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
                {
                    //Expt: YOffset ignore row-interleave -- verify both 2d/3d mips
                    OffsetY = GFX_ULONG_CAST(AddressOffset / pTexInfo->Pitch);
                    OffsetY *= 2;
                    TileAlignedOffsetY = GFX_ALIGN_FLOOR(OffsetY, pTileInfo->LogicalTileHeight * 2 * pTileInfo->LogicalTileDepth);
                    OffsetY -= TileAlignedOffsetY;
                    TileAlignedOffsetY /= 2;
                }
                else
                {
                    OffsetY            = GFX_ULONG_CAST(AddressOffset / pTexInfo->Pitch);
                    TileAlignedOffsetY = GFX_ALIGN_FLOOR(OffsetY, pTileInfo->LogicalTileHeight * pTileInfo->LogicalTileDepth);
                    OffsetY -= TileAlignedOffsetY;
                }
            }

            RenderAlignOffset =
            TileAlignedOffsetY * pTexInfo->Pitch +
            (TileAlignedOffsetX / pTileInfo->LogicalTileWidth) * pTileInfo->LogicalSize;

            // For Gen9+, Miptail Lods should be reported in a way that
            //      - Base Address equals tile-aligned "Miptail start address"
            //      - OffsetX equals to offset (in bytes) from "Miptail start Lod" to "current Lod" in geometric X direction
            //      - OffsetY and OffsetZ are their pixel distance from "Miptail start Lod" to "current Lod" in geometric Y, Z directions
            // Note: only Tile Yf and TileYs have Miptails and their Mips are always "tile aligned"

            if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
               (pReqInfo->MipLevel >= pTexInfo->Alignment.MipTailStartLod) &&
               // Planar surfaces do not support MIPs
               !GmmIsPlanar(pTexInfo->Format))
            {
                GetMipTailGeometryOffset(pTexInfo, pReqInfo->MipLevel, &OffsetX, &OffsetY, &OffsetZ);
            }
        }
        else
        {
            // Std swizzled and UV packed planes begin at tile-aligned
            // offsets and do not support MIPs, so no adjustment is needed
            RenderAlignOffset = AddressOffset;
            OffsetX = OffsetY = OffsetZ = 0;
        }
    }
    else
    {
        // Linear case make sure Render address is DWORD aligned.
        RenderAlignOffset = GFX_ALIGN_FLOOR(AddressOffset, GMM_BYTES(4));

        if(pTexInfo->Pitch)
        {
            OffsetX = GFX_ULONG_CAST((AddressOffset - RenderAlignOffset) % pTexInfo->Pitch);
            OffsetY = GFX_ULONG_CAST((AddressOffset - RenderAlignOffset) / pTexInfo->Pitch);
        }
        else
        {
            // One-dimensional textures (no height)
            OffsetX = GFX_ULONG_CAST(AddressOffset - RenderAlignOffset);
            OffsetY = 0;
        }
    }

    pReqInfo->Render.Offset64 = RenderAlignOffset;
    pReqInfo->Render.XOffset  = GFX_ULONG_CAST(OffsetX);
    pReqInfo->Render.YOffset  = GFX_ULONG_CAST(OffsetY);
    pReqInfo->Render.ZOffset  = GFX_ULONG_CAST(OffsetZ);

    return GMM_SUCCESS;
}